

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-abandon.c
# Opt level: O0

_Bool mi_abandoned_visit_blocks
                (mi_subproc_id_t subproc_id,int heap_tag,_Bool visit_blocks,
                mi_block_visit_fun *visitor,void *arg)

{
  _Bool _Var1;
  mi_segment_t *pmVar2;
  mi_heap_t *in_RCX;
  mi_segment_t *in_RDI;
  mi_subproc_t *in_R8;
  bool bVar3;
  _Bool ok;
  mi_segment_t *segment;
  mi_arena_field_cursor_t current;
  uint6 in_stack_ffffffffffffff98;
  byte bVar4;
  void *in_stack_ffffffffffffffb0;
  mi_block_visit_fun *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc3;
  int in_stack_ffffffffffffffc4;
  mi_segment_t *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd7;
  _Bool local_1;
  
  _Var1 = mi_option_is_enabled(mi_option_show_errors);
  if (_Var1) {
    _mi_subproc_from_id(in_RDI);
    _mi_arena_field_cursor_init
              (in_RCX,in_R8,(_Bool)in_stack_ffffffffffffffd7,
               (mi_arena_field_cursor_t *)in_stack_ffffffffffffffc8);
    bVar4 = 1;
    while( true ) {
      bVar3 = false;
      if ((bVar4 & 1) != 0) {
        pmVar2 = _mi_arena_segment_clear_abandoned_next
                           ((mi_arena_field_cursor_t *)
                            CONCAT17(bVar4,(uint7)in_stack_ffffffffffffff98));
        bVar3 = pmVar2 != (mi_segment_t *)0x0;
      }
      if (!bVar3) break;
      bVar4 = _mi_segment_visit_blocks
                        (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                         (_Bool)in_stack_ffffffffffffffc3,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0);
      _mi_arena_segment_mark_abandoned(in_RDI);
    }
    _mi_arena_field_cursor_done((mi_arena_field_cursor_t *)0xc637ed);
    local_1 = (_Bool)(bVar4 & 1);
  }
  else {
    _mi_error_message(0xe,
                      "internal error: can only visit abandoned blocks when MIMALLOC_VISIT_ABANDONED=ON"
                     );
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool mi_abandoned_visit_blocks(mi_subproc_id_t subproc_id, int heap_tag, bool visit_blocks, mi_block_visit_fun* visitor, void* arg) {
  // (unfortunately) the visit_abandoned option must be enabled from the start.
  // This is to avoid taking locks if abandoned list visiting is not required (as for most programs)
  if (!mi_option_is_enabled(mi_option_visit_abandoned)) {
    _mi_error_message(EFAULT, "internal error: can only visit abandoned blocks when MIMALLOC_VISIT_ABANDONED=ON");
    return false;
  }
  mi_arena_field_cursor_t current;
  _mi_arena_field_cursor_init(NULL, _mi_subproc_from_id(subproc_id), true /* visit all (blocking) */, &current);
  mi_segment_t* segment;
  bool ok = true;
  while (ok && (segment = _mi_arena_segment_clear_abandoned_next(&current)) != NULL) {
    ok = _mi_segment_visit_blocks(segment, heap_tag, visit_blocks, visitor, arg);
    _mi_arena_segment_mark_abandoned(segment);
  }
  _mi_arena_field_cursor_done(&current);
  return ok;
}